

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCovDeriveClean(Cov_Man_t *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar2;
  int local_3c;
  int i;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  Cov_Man_t *p_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    p_local = (Cov_Man_t *)Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    for (local_3c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
      pObj_00 = Abc_NtkCo(pNtk,local_3c);
      pAVar2 = Abc_ObjFanin0(pObj_00);
      iVar1 = Abc_ObjFaninC0(pObj_00);
      pAVar2 = Abc_NtkCovDeriveNodeInv_rec(p,(Abc_Ntk_t *)p_local,pAVar2,iVar1);
      Abc_ObjAddFanin((pObj_00->field_6).pCopy,pAVar2);
    }
    Abc_NtkLogicMakeSimpleCos((Abc_Ntk_t *)p_local,0);
    iVar1 = Abc_NtkCheck((Abc_Ntk_t *)p_local);
    if (iVar1 == 0) {
      printf("Abc_NtkCovDeriveInv: The network check has failed.\n");
      Abc_NtkDelete((Abc_Ntk_t *)p_local);
      p_local = (Cov_Man_t *)0x0;
    }
    return (Abc_Ntk_t *)p_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covBuild.c"
                ,0x16a,"Abc_Ntk_t *Abc_NtkCovDeriveClean(Cov_Man_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCovDeriveClean( Cov_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNodeNew;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // reconstruct the network
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pNodeNew = Abc_NtkCovDeriveNodeInv_rec( p, pNtkNew, Abc_ObjFanin0(pObj), Abc_ObjFaninC0(pObj) );
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }
    // add the COs
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCovDeriveInv: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}